

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrUtil.c
# Opt level: O0

void Rwr_ListAddToTail(Rwr_Node_t **ppList,Rwr_Node_t *pNode)

{
  Rwr_Node_t *local_20;
  Rwr_Node_t *pTemp;
  Rwr_Node_t *pNode_local;
  Rwr_Node_t **ppList_local;
  
  pNode_local = (Rwr_Node_t *)ppList;
  for (local_20 = *ppList; local_20 != (Rwr_Node_t *)0x0; local_20 = local_20->pNext) {
    pNode_local = (Rwr_Node_t *)&local_20->pNext;
  }
  *(Rwr_Node_t **)pNode_local = pNode;
  return;
}

Assistant:

void Rwr_ListAddToTail( Rwr_Node_t ** ppList, Rwr_Node_t * pNode )
{
    Rwr_Node_t * pTemp;
    // find the last one
    for ( pTemp = *ppList; pTemp; pTemp = pTemp->pNext )
        ppList = &pTemp->pNext;
    // attach at the end
    *ppList = pNode;
}